

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_file.c
# Opt level: O0

gravity_file_t * gravity_ifile_new(gravity_vm *vm,FILE *f)

{
  gravity_file_t *instance;
  FILE *f_local;
  gravity_vm *vm_local;
  
  if (f == (FILE *)0x0) {
    vm_local = (gravity_vm *)0x0;
  }
  else {
    vm_local = (gravity_vm *)gravity_calloc((gravity_vm *)0x0,1,0x38);
    if (vm_local == (gravity_vm *)0x0) {
      vm_local = (gravity_vm *)0x0;
    }
    else {
      vm_local->context = (gravity_hash_t *)gravity_class_file;
      vm_local->fiber = (gravity_fiber_t *)gravity_ifile_free;
      *(FILE **)&vm_local->aborted = f;
      if (vm != (gravity_vm *)0x0) {
        gravity_vm_transfer(vm,(gravity_object_t *)vm_local);
      }
    }
  }
  return (gravity_file_t *)vm_local;
}

Assistant:

static gravity_file_t *gravity_ifile_new (gravity_vm *vm, FILE *f) {
    if (!f) return NULL;
    
    gravity_file_t *instance = (gravity_file_t *)mem_alloc(NULL, sizeof(gravity_file_t));
    if (!instance) return NULL;
    
    instance->isa = gravity_class_file;
    instance->gc.free = gravity_ifile_free;
    instance->file = f;

    if (vm) gravity_vm_transfer(vm, (gravity_object_t*) instance);
    return instance;
}